

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.h
# Opt level: O3

void __thiscall
Generic_Command_As_Console_Command<DeselectGenericCommand>::trigger
          (Generic_Command_As_Console_Command<DeselectGenericCommand> *this,string_view parameters)

{
  ResponseLine *__ptr_00;
  pointer *__ptr;
  ostream *poVar1;
  ResponseLine *local_28;
  
  local_28 = (ResponseLine *)
             (**(code **)(DeselectGenericCommand_instance.super_DeselectGenericCommand._0_8_ + 0x18)
             )(&DeselectGenericCommand_instance,parameters._M_len,parameters._M_str);
  while (local_28 != (ResponseLine *)0x0) {
    poVar1 = (ostream *)&std::cout;
    if ((*(uint *)(local_28 + 0x20) & 0xfffffffe) == 2) {
      poVar1 = (ostream *)&std::cerr;
    }
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)local_28,*(long *)(local_28 + 8));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    __ptr_00 = local_28;
    local_28 = *(ResponseLine **)(local_28 + 0x28);
    std::default_delete<Jupiter::GenericCommand::ResponseLine>::operator()
              ((default_delete<Jupiter::GenericCommand::ResponseLine> *)&local_28,__ptr_00);
  }
  DeselectGenericCommand_instance.super_DeselectGenericCommand.super_GenericCommand =
       DeselectGenericCommand_instance.super_DeselectGenericCommand.super_GenericCommand;
  DeselectGenericCommand_instance.super_DeselectGenericCommand._1_7_ =
       DeselectGenericCommand_instance.super_DeselectGenericCommand._1_7_;
  return;
}

Assistant:

void Generic_Command_As_Console_Command<T>::trigger(std::string_view parameters) {
	std::unique_ptr<Jupiter::GenericCommand::ResponseLine> response_line{ T::instance.trigger(parameters) };
	while (response_line != nullptr) {
		auto& out_stream = response_line->type == Jupiter::GenericCommand::DisplayType::PublicError
			|| response_line->type == Jupiter::GenericCommand::DisplayType::PrivateError ? std::cerr : std::cout;

		out_stream << response_line->response << std::endl;
		response_line.reset(response_line->next);
	}
}